

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::InstanceIntersector1MB>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  bool bVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  AABBNodeMB4D *node1;
  ulong uVar12;
  InstancePrimitive *prim;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong unaff_R14;
  size_t mask;
  ulong uVar19;
  byte bVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  float fVar33;
  float fVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined4 uVar37;
  undefined8 uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 in_ZMM18 [64];
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  Precalculations local_24a9;
  ulong local_24a8;
  ulong local_24a0;
  ulong local_2498;
  ulong local_2490;
  ulong local_2488;
  ulong *local_2480;
  undefined1 local_2478 [32];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2370[0] = 0;
    if (local_2378 != 8) {
      aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
      auVar5 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3])
                         );
      auVar6 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar22._8_4_ = 0x7fffffff;
      auVar22._0_8_ = 0x7fffffff7fffffff;
      auVar22._12_4_ = 0x7fffffff;
      auVar22 = vandps_avx512vl((undefined1  [16])aVar2,auVar22);
      auVar39._8_4_ = 0x219392ef;
      auVar39._0_8_ = 0x219392ef219392ef;
      auVar39._12_4_ = 0x219392ef;
      uVar13 = vcmpps_avx512vl(auVar22,auVar39,1);
      bVar3 = (bool)((byte)uVar13 & 1);
      auVar23._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.x;
      bVar3 = (bool)((byte)(uVar13 >> 1) & 1);
      auVar23._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.y;
      bVar3 = (bool)((byte)(uVar13 >> 2) & 1);
      auVar23._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.z;
      bVar3 = (bool)((byte)(uVar13 >> 3) & 1);
      auVar23._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * aVar2.field_3.a;
      auVar22 = vrcp14ps_avx512vl(auVar23);
      auVar24._8_4_ = 0x3f800000;
      auVar24._0_8_ = &DAT_3f8000003f800000;
      auVar24._12_4_ = 0x3f800000;
      auVar24 = vfnmadd213ps_avx512vl(auVar23,auVar22,auVar24);
      local_2480 = local_2368;
      auVar23 = vfmadd132ps_fma(auVar24,auVar22,auVar22);
      fVar33 = auVar23._0_4_;
      local_23b8._4_4_ = fVar33;
      local_23b8._0_4_ = fVar33;
      local_23b8._8_4_ = fVar33;
      local_23b8._12_4_ = fVar33;
      local_23b8._16_4_ = fVar33;
      local_23b8._20_4_ = fVar33;
      local_23b8._24_4_ = fVar33;
      local_23b8._28_4_ = fVar33;
      auVar41 = ZEXT3264(local_23b8);
      auVar22 = vmovshdup_avx(auVar23);
      uVar38 = auVar22._0_8_;
      local_23d8._8_8_ = uVar38;
      local_23d8._0_8_ = uVar38;
      local_23d8._16_8_ = uVar38;
      local_23d8._24_8_ = uVar38;
      auVar42 = ZEXT3264(local_23d8);
      auVar24 = vshufpd_avx(auVar23,auVar23,1);
      auVar29._8_4_ = 2;
      auVar29._0_8_ = 0x200000002;
      auVar29._12_4_ = 2;
      auVar29._16_4_ = 2;
      auVar29._20_4_ = 2;
      auVar29._24_4_ = 2;
      auVar29._28_4_ = 2;
      local_23f8 = vpermps_avx2(auVar29,ZEXT1632(auVar23));
      auVar43 = ZEXT3264(local_23f8);
      fVar34 = fVar33 * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar25._8_4_ = 1;
      auVar25._0_8_ = 0x100000001;
      auVar25._12_4_ = 1;
      auVar25._16_4_ = 1;
      auVar25._20_4_ = 1;
      auVar25._24_4_ = 1;
      auVar25._28_4_ = 1;
      auVar35 = ZEXT1632(CONCAT412(auVar23._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                   CONCAT48(auVar23._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2]
                                            ,CONCAT44(auVar23._4_4_ *
                                                      (ray->super_RayK<1>).org.field_0.m128[1],
                                                      fVar34))));
      auVar25 = vpermps_avx2(auVar25,auVar35);
      auVar35 = vpermps_avx2(auVar29,auVar35);
      local_2488 = (ulong)(fVar33 < 0.0) << 5;
      local_2490 = (ulong)(auVar22._0_4_ < 0.0) << 5 | 0x40;
      local_2498 = (ulong)(auVar24._0_4_ < 0.0) << 5 | 0x80;
      local_24a0 = local_2488 ^ 0x20;
      local_24a8 = local_2490 ^ 0x20;
      uVar18 = local_2498 ^ 0x20;
      uVar37 = auVar5._0_4_;
      local_2418._4_4_ = uVar37;
      local_2418._0_4_ = uVar37;
      local_2418._8_4_ = uVar37;
      local_2418._12_4_ = uVar37;
      local_2418._16_4_ = uVar37;
      local_2418._20_4_ = uVar37;
      local_2418._24_4_ = uVar37;
      local_2418._28_4_ = uVar37;
      auVar44 = ZEXT3264(local_2418);
      uVar37 = auVar6._0_4_;
      auVar36 = ZEXT3264(CONCAT428(uVar37,CONCAT424(uVar37,CONCAT420(uVar37,CONCAT416(uVar37,
                                                  CONCAT412(uVar37,CONCAT48(uVar37,CONCAT44(uVar37,
                                                  uVar37))))))));
      local_2438._0_8_ = CONCAT44(fVar34,fVar34) ^ 0x8000000080000000;
      local_2438._8_4_ = -fVar34;
      local_2438._12_4_ = -fVar34;
      local_2438._16_4_ = -fVar34;
      local_2438._20_4_ = -fVar34;
      local_2438._24_4_ = -fVar34;
      local_2438._28_4_ = -fVar34;
      auVar45 = ZEXT3264(local_2438);
      local_2458._0_8_ = auVar25._0_8_ ^ 0x8000000080000000;
      local_2458._8_4_ = auVar25._8_4_ ^ 0x80000000;
      local_2458._12_4_ = auVar25._12_4_ ^ 0x80000000;
      local_2458._16_4_ = auVar25._16_4_ ^ 0x80000000;
      local_2458._20_4_ = auVar25._20_4_ ^ 0x80000000;
      local_2458._24_4_ = auVar25._24_4_ ^ 0x80000000;
      local_2458._28_4_ = auVar25._28_4_ ^ 0x80000000;
      auVar40 = ZEXT3264(local_2458);
      local_2478._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
      local_2478._8_4_ = auVar35._8_4_ ^ 0x80000000;
      local_2478._12_4_ = auVar35._12_4_ ^ 0x80000000;
      local_2478._16_4_ = auVar35._16_4_ ^ 0x80000000;
      local_2478._20_4_ = auVar35._20_4_ ^ 0x80000000;
      local_2478._24_4_ = auVar35._24_4_ ^ 0x80000000;
      local_2478._28_4_ = auVar35._28_4_ ^ 0x80000000;
      auVar46 = ZEXT3264(local_2478);
      auVar25 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
      auVar47 = ZEXT3264(auVar25);
      auVar25 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
      auVar48 = ZEXT3264(auVar25);
      uVar13 = local_2488;
      uVar14 = local_2490;
      uVar15 = local_2498;
      uVar16 = local_24a8;
      uVar19 = local_24a0;
      do {
        do {
          if (local_2480 == &local_2378) {
            return;
          }
          pfVar1 = (float *)(local_2480 + -1);
          local_2480 = local_2480 + -2;
        } while ((ray->super_RayK<1>).tfar < *pfVar1);
        uVar21 = *local_2480;
        do {
          auVar35 = auVar46._0_32_;
          auVar25 = auVar40._0_32_;
          if ((uVar21 & 8) == 0) {
            uVar12 = uVar21 & 0xfffffffffffffff0;
            uVar37 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
            auVar27._4_4_ = uVar37;
            auVar27._0_4_ = uVar37;
            auVar27._8_4_ = uVar37;
            auVar27._12_4_ = uVar37;
            auVar27._16_4_ = uVar37;
            auVar27._20_4_ = uVar37;
            auVar27._24_4_ = uVar37;
            auVar27._28_4_ = uVar37;
            auVar5 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar13),auVar27,
                                     *(undefined1 (*) [32])(uVar12 + 0x40 + uVar13));
            auVar5 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar41._0_32_,auVar45._0_32_);
            auVar29 = vmaxps_avx(auVar44._0_32_,ZEXT1632(auVar5));
            auVar5 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar14),auVar27,
                                     *(undefined1 (*) [32])(uVar12 + 0x40 + uVar14));
            auVar6 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar15),auVar27,
                                     *(undefined1 (*) [32])(uVar12 + 0x40 + uVar15));
            auVar5 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar42._0_32_,auVar25);
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar43._0_32_,auVar35);
            auVar4 = vmaxps_avx(ZEXT1632(auVar5),ZEXT1632(auVar6));
            auVar26 = vmaxps_avx512vl(auVar29,auVar4);
            in_ZMM18 = ZEXT3264(auVar26);
            auVar5 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar19),auVar27,
                                     *(undefined1 (*) [32])(uVar12 + 0x40 + uVar19));
            auVar6 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar16),auVar27,
                                     *(undefined1 (*) [32])(uVar12 + 0x40 + uVar16));
            auVar5 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar41._0_32_,auVar45._0_32_);
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar42._0_32_,auVar25);
            auVar22 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar18),auVar27,
                                      *(undefined1 (*) [32])(uVar12 + 0x40 + uVar18));
            auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar43._0_32_,auVar35);
            auVar29 = vminps_avx(ZEXT1632(auVar6),ZEXT1632(auVar22));
            auVar4 = vminps_avx(auVar36._0_32_,ZEXT1632(auVar5));
            auVar29 = vminps_avx(auVar4,auVar29);
            if (((uint)uVar21 & 7) == 6) {
              uVar38 = vcmpps_avx512vl(auVar26,auVar29,2);
              uVar9 = vcmpps_avx512vl(auVar27,*(undefined1 (*) [32])(uVar12 + 0x1c0),0xd);
              uVar10 = vcmpps_avx512vl(auVar27,*(undefined1 (*) [32])(uVar12 + 0x1e0),1);
              bVar20 = (byte)uVar38 & (byte)uVar9 & (byte)uVar10;
            }
            else {
              uVar38 = vcmpps_avx512vl(auVar26,auVar29,2);
              bVar20 = (byte)uVar38;
            }
            unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),(uint)bVar20);
          }
          if ((uVar21 & 8) == 0) {
            if (unaff_R14 == 0) {
              iVar11 = 4;
            }
            else {
              auVar29 = *(undefined1 (*) [32])(uVar21 & 0xfffffffffffffff0);
              auVar4 = ((undefined1 (*) [32])(uVar21 & 0xfffffffffffffff0))[1];
              auVar26 = vmovdqa64_avx512vl(auVar47._0_32_);
              auVar32 = in_ZMM18._0_32_;
              auVar26 = vpternlogd_avx512vl(auVar26,auVar32,auVar48._0_32_,0xf8);
              uVar21 = unaff_R14 & 0xffffffff;
              auVar27 = vpcompressd_avx512vl(auVar26);
              bVar3 = (bool)((byte)uVar21 & 1);
              auVar31._0_4_ = (uint)bVar3 * auVar27._0_4_ | (uint)!bVar3 * auVar26._0_4_;
              bVar3 = (bool)((byte)(uVar21 >> 1) & 1);
              auVar31._4_4_ = (uint)bVar3 * auVar27._4_4_ | (uint)!bVar3 * auVar26._4_4_;
              bVar3 = (bool)((byte)(uVar21 >> 2) & 1);
              auVar31._8_4_ = (uint)bVar3 * auVar27._8_4_ | (uint)!bVar3 * auVar26._8_4_;
              bVar3 = (bool)((byte)(uVar21 >> 3) & 1);
              auVar31._12_4_ = (uint)bVar3 * auVar27._12_4_ | (uint)!bVar3 * auVar26._12_4_;
              bVar3 = (bool)((byte)(uVar21 >> 4) & 1);
              auVar31._16_4_ = (uint)bVar3 * auVar27._16_4_ | (uint)!bVar3 * auVar26._16_4_;
              bVar3 = (bool)((byte)(uVar21 >> 5) & 1);
              auVar31._20_4_ = (uint)bVar3 * auVar27._20_4_ | (uint)!bVar3 * auVar26._20_4_;
              bVar3 = (bool)((byte)(uVar21 >> 6) & 1);
              auVar31._24_4_ = (uint)bVar3 * auVar27._24_4_ | (uint)!bVar3 * auVar26._24_4_;
              bVar3 = (bool)((byte)(uVar21 >> 7) & 1);
              auVar31._28_4_ = (uint)bVar3 * auVar27._28_4_ | (uint)!bVar3 * auVar26._28_4_;
              auVar26 = vpermt2q_avx512vl(auVar29,auVar31,auVar4);
              uVar21 = auVar26._0_8_;
              iVar11 = 0;
              uVar12 = unaff_R14 - 1 & unaff_R14;
              if (uVar12 != 0) {
                auVar26 = vpshufd_avx2(auVar31,0x55);
                vpermt2q_avx512vl(auVar29,auVar26,auVar4);
                auVar27 = vpminsd_avx2(auVar31,auVar26);
                auVar26 = vpmaxsd_avx2(auVar31,auVar26);
                uVar12 = uVar12 - 1 & uVar12;
                if (uVar12 == 0) {
                  auVar25 = vpermi2q_avx512vl(auVar27,auVar29,auVar4);
                  uVar21 = auVar25._0_8_;
                  auVar25 = vpermt2q_avx512vl(auVar29,auVar26,auVar4);
                  *local_2480 = auVar25._0_8_;
                  auVar25 = vpermd_avx512vl(auVar26,auVar32);
                  *(int *)(local_2480 + 1) = auVar25._0_4_;
                  local_2480 = local_2480 + 2;
                }
                else {
                  auVar8 = vpshufd_avx2(auVar31,0xaa);
                  vpermt2q_avx512vl(auVar29,auVar8,auVar4);
                  auVar7 = vpminsd_avx2(auVar27,auVar8);
                  auVar27 = vpmaxsd_avx2(auVar27,auVar8);
                  auVar8 = vpminsd_avx2(auVar26,auVar27);
                  auVar26 = vpmaxsd_avx2(auVar26,auVar27);
                  uVar12 = uVar12 - 1 & uVar12;
                  if (uVar12 == 0) {
                    auVar25 = vpermi2q_avx512vl(auVar7,auVar29,auVar4);
                    uVar21 = auVar25._0_8_;
                    auVar25 = vpermt2q_avx512vl(auVar29,auVar26,auVar4);
                    *local_2480 = auVar25._0_8_;
                    auVar25 = vpermd_avx512vl(auVar26,auVar32);
                    *(int *)(local_2480 + 1) = auVar25._0_4_;
                    auVar25 = vpermt2q_avx512vl(auVar29,auVar8,auVar4);
                    local_2480[2] = auVar25._0_8_;
                    auVar25 = vpermd_avx512vl(auVar8,auVar32);
                    *(int *)(local_2480 + 3) = auVar25._0_4_;
                    local_2480 = local_2480 + 4;
                  }
                  else {
                    auVar28 = vmovdqa64_avx512vl(auVar32);
                    auVar27 = vpshufd_avx2(auVar31,0xff);
                    vpermt2q_avx512vl(auVar29,auVar27,auVar4);
                    auVar32 = vpminsd_avx2(auVar7,auVar27);
                    auVar27 = vpmaxsd_avx2(auVar7,auVar27);
                    auVar7 = vpminsd_avx2(auVar8,auVar27);
                    auVar27 = vpmaxsd_avx2(auVar8,auVar27);
                    auVar8 = vpminsd_avx2(auVar26,auVar27);
                    auVar26 = vpmaxsd_avx2(auVar26,auVar27);
                    uVar12 = uVar12 - 1 & uVar12;
                    iVar11 = 0;
                    if (uVar12 == 0) {
                      auVar27 = vpermi2q_avx512vl(auVar32,auVar29,auVar4);
                      uVar21 = auVar27._0_8_;
                      auVar27 = vpermt2q_avx512vl(auVar29,auVar26,auVar4);
                      *local_2480 = auVar27._0_8_;
                      auVar27 = vmovdqa64_avx512vl(auVar28);
                      in_ZMM18 = ZEXT3264(auVar27);
                      auVar26 = vpermd_avx512vl(auVar26,auVar28);
                      *(int *)(local_2480 + 1) = auVar26._0_4_;
                      auVar26 = vpermt2q_avx512vl(auVar29,auVar8,auVar4);
                      local_2480[2] = auVar26._0_8_;
                      auVar26 = vpermd_avx512vl(auVar8,auVar28);
                      *(int *)(local_2480 + 3) = auVar26._0_4_;
                      auVar29 = vpermt2q_avx512vl(auVar29,auVar7,auVar4);
                      local_2480[4] = auVar29._0_8_;
                      auVar29 = vpermd_avx512vl(auVar7,auVar28);
                      *(int *)(local_2480 + 5) = auVar29._0_4_;
                      local_2480 = local_2480 + 6;
                      auVar40 = ZEXT3264(auVar25);
                      auVar46 = ZEXT3264(auVar35);
                    }
                    else {
                      auVar30 = valignd_avx512vl(auVar31,auVar31,3);
                      auVar27 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                      auVar31 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                     CONCAT48(0x80000000,
                                                                              0x8000000080000000))),
                                                  auVar27,auVar32);
                      auVar27 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                      auVar31 = vpermt2d_avx512vl(auVar31,auVar27,auVar7);
                      auVar31 = vpermt2d_avx512vl(auVar31,auVar27,auVar8);
                      auVar27 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                      auVar26 = vpermt2d_avx512vl(auVar31,auVar27,auVar26);
                      auVar40 = ZEXT3264(auVar26);
                      uVar21 = uVar12;
                      do {
                        auVar27 = auVar40._0_32_;
                        auVar26._8_4_ = 1;
                        auVar26._0_8_ = 0x100000001;
                        auVar26._12_4_ = 1;
                        auVar26._16_4_ = 1;
                        auVar26._20_4_ = 1;
                        auVar26._24_4_ = 1;
                        auVar26._28_4_ = 1;
                        auVar26 = vpermd_avx2(auVar26,auVar30);
                        auVar30 = valignd_avx512vl(auVar30,auVar30,1);
                        vpermt2q_avx512vl(auVar29,auVar30,auVar4);
                        uVar21 = uVar21 - 1 & uVar21;
                        uVar38 = vpcmpd_avx512vl(auVar26,auVar27,5);
                        auVar26 = vpmaxsd_avx2(auVar26,auVar27);
                        bVar20 = (byte)uVar38 << 1;
                        auVar27 = valignd_avx512vl(auVar27,auVar27,7);
                        bVar3 = (bool)((byte)uVar38 & 1);
                        auVar32._4_4_ = (uint)bVar3 * auVar27._4_4_ | (uint)!bVar3 * auVar26._4_4_;
                        auVar32._0_4_ = auVar26._0_4_;
                        bVar3 = (bool)(bVar20 >> 2 & 1);
                        auVar32._8_4_ = (uint)bVar3 * auVar27._8_4_ | (uint)!bVar3 * auVar26._8_4_;
                        bVar3 = (bool)(bVar20 >> 3 & 1);
                        auVar32._12_4_ =
                             (uint)bVar3 * auVar27._12_4_ | (uint)!bVar3 * auVar26._12_4_;
                        bVar3 = (bool)(bVar20 >> 4 & 1);
                        auVar32._16_4_ =
                             (uint)bVar3 * auVar27._16_4_ | (uint)!bVar3 * auVar26._16_4_;
                        bVar3 = (bool)(bVar20 >> 5 & 1);
                        auVar32._20_4_ =
                             (uint)bVar3 * auVar27._20_4_ | (uint)!bVar3 * auVar26._20_4_;
                        bVar3 = (bool)(bVar20 >> 6 & 1);
                        auVar32._24_4_ =
                             (uint)bVar3 * auVar27._24_4_ | (uint)!bVar3 * auVar26._24_4_;
                        auVar32._28_4_ =
                             (uint)(bVar20 >> 7) * auVar27._28_4_ |
                             (uint)!(bool)(bVar20 >> 7) * auVar26._28_4_;
                        auVar40 = ZEXT3264(auVar32);
                      } while (uVar21 != 0);
                      lVar17 = POPCOUNT(uVar12) + 3;
                      do {
                        auVar26 = vpermi2q_avx512vl(auVar32,auVar29,auVar4);
                        *local_2480 = auVar26._0_8_;
                        auVar27 = auVar40._0_32_;
                        auVar26 = vpermd_avx512vl(auVar27,auVar28);
                        *(int *)(local_2480 + 1) = auVar26._0_4_;
                        auVar32 = valignd_avx512vl(auVar27,auVar27,1);
                        local_2480 = local_2480 + 2;
                        auVar40 = ZEXT3264(auVar32);
                        lVar17 = lVar17 + -1;
                      } while (lVar17 != 0);
                      auVar29 = vpermt2q_avx512vl(auVar29,auVar32,auVar4);
                      uVar21 = auVar29._0_8_;
                      auVar40 = ZEXT3264(auVar25);
                      auVar46 = ZEXT3264(auVar35);
                      auVar25 = vmovdqa64_avx512vl(auVar28);
                      in_ZMM18 = ZEXT3264(auVar25);
                    }
                  }
                }
              }
            }
          }
          else {
            iVar11 = 6;
          }
        } while (iVar11 == 0);
        if (iVar11 == 6) {
          local_2398 = vmovdqu64_avx512vl(in_ZMM18._0_32_);
          lVar17 = (ulong)((uint)uVar21 & 0xf) - 8;
          if (lVar17 != 0) {
            prim = (InstancePrimitive *)(uVar21 & 0xfffffffffffffff0);
            do {
              InstanceIntersector1MB::intersect(&local_24a9,ray,context,prim);
              prim = prim + 1;
              lVar17 = lVar17 + -1;
            } while (lVar17 != 0);
          }
          fVar33 = (ray->super_RayK<1>).tfar;
          auVar36 = ZEXT3264(CONCAT428(fVar33,CONCAT424(fVar33,CONCAT420(fVar33,CONCAT416(fVar33,
                                                  CONCAT412(fVar33,CONCAT48(fVar33,CONCAT44(fVar33,
                                                  fVar33))))))));
          auVar41 = ZEXT3264(local_23b8);
          auVar42 = ZEXT3264(local_23d8);
          auVar43 = ZEXT3264(local_23f8);
          auVar44 = ZEXT3264(local_2418);
          auVar45 = ZEXT3264(local_2438);
          auVar40 = ZEXT3264(local_2458);
          auVar46 = ZEXT3264(local_2478);
          auVar25 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
          auVar47 = ZEXT3264(auVar25);
          auVar25 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
          auVar48 = ZEXT3264(auVar25);
          auVar25 = vmovdqu64_avx512vl(local_2398);
          in_ZMM18 = ZEXT3264(auVar25);
          uVar13 = local_2488;
          uVar14 = local_2490;
          uVar15 = local_2498;
          uVar16 = local_24a8;
          uVar19 = local_24a0;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }